

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  undefined1 extraout_AL;
  uint uVar2;
  Rep *pRVar3;
  string *psVar4;
  MessageLite *prototype;
  MessageLite *extraout_RAX;
  MessageLite *pMVar5;
  ThreadSafeArena *this_00;
  ThreadSafeArena *extraout_RDX;
  long lVar6;
  RepeatedPtrFieldBase *this_01;
  long lVar7;
  bool bVar8;
  LogMessageFatal aLStack_50 [16];
  RepeatedPtrFieldBase *pRStack_40;
  long lStack_38;
  
  iVar1 = this->current_size_;
  lVar7 = (long)iVar1;
  this_00 = (ThreadSafeArena *)this->tagged_rep_or_elem_;
  if (((ulong)this_00 & 1) == 0) {
    uVar2 = (uint)(this_00 != (ThreadSafeArena *)0x0);
  }
  else {
    pRVar3 = rep(this);
    uVar2 = pRVar3->allocated_size;
  }
  if ((int)uVar2 < iVar1) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (lVar7,(long)(int)uVar2,"size() <= allocated_size()");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    this_00 = (ThreadSafeArena *)this->tagged_rep_or_elem_;
    if (((ulong)this_00 & 1) == 0) {
      uVar2 = (uint)(this_00 != (ThreadSafeArena *)0x0);
    }
    else {
      pRVar3 = rep(this);
      uVar2 = pRVar3->allocated_size;
    }
    lVar6 = (long)this->capacity_proxy_ + 1;
    if ((int)lVar6 < (int)uVar2) {
      prototype = (MessageLite *)
                  absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            ((long)(int)uVar2,lVar6,"allocated_size() <= Capacity()");
    }
    else {
      prototype = (MessageLite *)0x0;
    }
    if (prototype == (MessageLite *)0x0) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar8 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar3 = rep(this);
        bVar8 = this->capacity_proxy_ < pRVar3->allocated_size;
      }
      return bVar8;
    }
  }
  else {
    AllocatedSizeAtCapacity();
    prototype = extraout_RAX;
  }
  this_01 = (RepeatedPtrFieldBase *)&stack0xffffffffffffffe0;
  AllocatedSizeAtCapacity();
  pMVar5 = prototype;
  pRStack_40 = this;
  lStack_38 = lVar7;
  if (extraout_RDX == (ThreadSafeArena *)0x0 && this_00 != (ThreadSafeArena *)0x0) {
    if (prototype != (MessageLite *)0x0) {
      ThreadSafeArena::AddCleanup
                (this_00,prototype,arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  else if (this_00 != extraout_RDX) {
    if (extraout_RDX == (ThreadSafeArena *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
                 ,0x1fb,0x16,"value_arena != nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_50);
    }
    pMVar5 = NewFromPrototypeHelper(prototype,(Arena *)this_00);
    GenericTypeHandler<google::protobuf::MessageLite>::Merge(prototype,pMVar5);
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
            (this_01,pMVar5);
  return (bool)extraout_AL;
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }